

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSizeTests.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Functional::Texture2DSizeCase::init(Texture2DSizeCase *this,EVP_PKEY_CTX *ctx)

{
  int a;
  Texture2D *this_00;
  Texture2D *pTVar1;
  PixelBufferAccess *access;
  int local_5c;
  Vector<float,_4> local_44;
  Vector<float,_4> local_34;
  int local_24;
  int local_20;
  int levelNdx;
  int numLevels;
  Texture2DSizeCase *local_10;
  Texture2DSizeCase *this_local;
  
  local_10 = this;
  this_00 = (Texture2D *)operator_new(0x70);
  glu::Texture2D::Texture2D
            (this_00,this->m_renderCtx,this->m_format,this->m_dataType,this->m_width,this->m_height)
  ;
  this->m_texture = this_00;
  if ((this->m_useMipmaps & 1U) == 0) {
    local_5c = 1;
  }
  else {
    a = de::max<int>(this->m_width,this->m_height);
    local_5c = ::deLog2Floor32(a);
    local_5c = local_5c + 1;
  }
  local_20 = local_5c;
  for (local_24 = 0; local_24 < local_20; local_24 = local_24 + 1) {
    pTVar1 = glu::Texture2D::getRefTexture(this->m_texture);
    tcu::Texture2D::allocLevel(pTVar1,local_24);
    pTVar1 = glu::Texture2D::getRefTexture(this->m_texture);
    access = tcu::TextureLevelPyramid::getLevel(&pTVar1->super_TextureLevelPyramid,local_24);
    tcu::Vector<float,_4>::Vector(&local_34,-1.0,-1.0,-1.0,2.0);
    tcu::Vector<float,_4>::Vector(&local_44,1.0,1.0,1.0,0.0);
    tcu::fillWithComponentGradients(access,&local_34,&local_44);
  }
  return local_24;
}

Assistant:

void Texture2DSizeCase::init (void)
{
	DE_ASSERT(!m_texture);
	m_texture = new Texture2D(m_renderCtx, m_format, m_dataType, m_width, m_height);

	int numLevels = m_useMipmaps ? deLog2Floor32(de::max(m_width, m_height))+1 : 1;

	// Fill levels.
	for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
	{
		m_texture->getRefTexture().allocLevel(levelNdx);
		tcu::fillWithComponentGradients(m_texture->getRefTexture().getLevel(levelNdx), tcu::Vec4(-1.0f, -1.0f, -1.0f, 2.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 0.0f));
	}
}